

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlelement.c
# Opt level: O2

err_t EBML_ElementRenderHead
                (ebml_element *Element,stream *Output,bool_t bKeepPosition,filepos_t *Rendered)

{
  uint8_t SizeLength;
  uint uVar1;
  filepos_t fVar2;
  byte bVar3;
  long lVar4;
  size_t sVar5;
  bool_t bVar6;
  err_t eVar7;
  long lVar8;
  long lVar9;
  ulong CodedSize;
  long lStack_70;
  uint8_t FinalHead [12];
  size_t i;
  
  if (Output != (stream *)0x0) {
    lVar4 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
    sVar5 = EBML_FillBufferID(FinalHead,0xc,Element->Context->Id);
    fVar2 = Element->DataSize;
    SizeLength = Element->SizeLength;
    bVar6 = EBML_ElementIsFiniteSize(Element);
    bVar3 = EBML_CodedSizeLength(fVar2,SizeLength,bVar6);
    fVar2 = Element->DataSize;
    CodedSize = (ulong)bVar3;
    bVar6 = EBML_ElementIsFiniteSize(Element);
    EBML_CodedValueLength(fVar2,CodedSize,FinalHead + sVar5,bVar6);
    eVar7 = (**(code **)((long)(Output->Base).VMT + 0x70))(Output,FinalHead,sVar5 + CodedSize,&i);
    lVar8 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
    if (bKeepPosition == 0) {
      lVar9 = lVar8 - (sVar5 + CodedSize);
      Element->ElementPosition = lVar9;
      uVar1 = Element->Context->Id;
      if (uVar1 < 0x100) {
        lStack_70 = 1;
      }
      else if (uVar1 < 0x10000) {
        lStack_70 = 2;
      }
      else {
        lStack_70 = 4 - (ulong)(uVar1 < 0x1000000);
      }
      lStack_70 = lStack_70 + lVar9;
      Element->SizePosition = lStack_70;
      Element->EndPosition = lStack_70 + CodedSize + Element->DataSize;
    }
    if (Rendered != (filepos_t *)0x0) {
      *Rendered = lVar8 - lVar4;
    }
    return eVar7;
  }
  __assert_fail("(const void*)(Output)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlelement.c"
                ,0x134,
                "err_t EBML_ElementRenderHead(ebml_element *, struct stream *, bool_t, filepos_t *)"
               );
}

Assistant:

err_t EBML_ElementRenderHead(ebml_element *Element, struct stream *Output, bool_t bKeepPosition, filepos_t *Rendered)
{
    err_t Err;
    uint8_t FinalHead[4+8]; // Class D + 64 bits coded size
    size_t i,FinalHeadSize;
    int CodedSize;
    filepos_t PosAfter,PosBefore = Stream_Seek(Output,0,SEEK_CUR);

    FinalHeadSize = EBML_FillBufferID(FinalHead,sizeof(FinalHead),Element->Context->Id);

    CodedSize = EBML_CodedSizeLength(Element->DataSize, Element->SizeLength, EBML_ElementIsFiniteSize(Element));
    EBML_CodedValueLength(Element->DataSize, CodedSize, &FinalHead[FinalHeadSize], EBML_ElementIsFiniteSize(Element));
    FinalHeadSize += CodedSize;

    Err = Stream_Write(Output, FinalHead, FinalHeadSize, &i);
    PosAfter = Stream_Seek(Output,0,SEEK_CUR);
    if (!bKeepPosition) {
        Element->ElementPosition = PosAfter - FinalHeadSize;
        Element->SizePosition = Element->ElementPosition + GetIdLength(Element->Context->Id);
        Element->EndPosition = Element->SizePosition + CodedSize + Element->DataSize;
    }
    if (Rendered)
        *Rendered = PosAfter - PosBefore;
    return Err;
}